

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int xmlidDocTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  char *__filename;
  char *temp;
  uint local_30;
  int ret;
  int res;
  int options_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  local_30 = 0;
  xpathDocument = (xmlDocPtr)xmlReadFile(filename,0,options | 10);
  if (xpathDocument == (xmlDocPtr)0x0) {
    fprintf(_stderr,"Failed to load %s\n",filename);
    filename_local._4_4_ = 0xffffffff;
  }
  else {
    __filename = resultFilename(filename,temp_directory,".res");
    if (__filename == (char *)0x0) {
      fprintf(_stderr,"Out of memory\n");
      fatalError();
    }
    xpathOutput = (FILE *)fopen64(__filename,"wb");
    if ((FILE *)xpathOutput == (FILE *)0x0) {
      fprintf(_stderr,"failed to open output file %s\n",__filename);
      xmlFreeDoc(xpathDocument);
      free(__filename);
      filename_local._4_4_ = 0xffffffff;
    }
    else {
      testXPath("id(\'bar\')",0,0);
      fclose((FILE *)xpathOutput);
      if (result != (char *)0x0) {
        iVar1 = compareFiles(__filename,result);
        if (iVar1 != 0) {
          fprintf(_stderr,"Result for %s failed in %s\n",filename,result);
        }
        local_30 = (uint)(iVar1 != 0);
      }
      if (__filename != (char *)0x0) {
        unlink(__filename);
        free(__filename);
      }
      xmlFreeDoc(xpathDocument);
      if ((err != (char *)0x0) &&
         (iVar1 = compareFileMem(err,testErrors,testErrorsSize), iVar1 != 0)) {
        fprintf(_stderr,"Error for %s failed\n",filename);
        local_30 = 1;
      }
      filename_local._4_4_ = local_30;
    }
  }
  return filename_local._4_4_;
}

Assistant:

static int
xmlidDocTest(const char *filename,
             const char *result,
             const char *err,
             int options) {

    int res = 0;
    int ret = 0;
    char *temp;

    xpathDocument = xmlReadFile(filename, NULL,
                                options | XML_PARSE_DTDATTR | XML_PARSE_NOENT);
    if (xpathDocument == NULL) {
        fprintf(stderr, "Failed to load %s\n", filename);
	return(-1);
    }

    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    xpathOutput = fopen(temp, "wb");
    if (xpathOutput == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
        xmlFreeDoc(xpathDocument);
        free(temp);
	return(-1);
    }

    testXPath("id('bar')", 0, 0);

    fclose(xpathOutput);
    if (result != NULL) {
	ret = compareFiles(temp, result);
	if (ret) {
	    fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	    res = 1;
	}
    }

    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }
    xmlFreeDoc(xpathDocument);

    if (err != NULL) {
	ret = compareFileMem(err, testErrors, testErrorsSize);
	if (ret != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    res = 1;
	}
    }
    return(res);
}